

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::mouseReleaseEvent(QGraphicsView *this,QMouseEvent *event)

{
  bool bVar1;
  MouseButton MVar2;
  Int IVar3;
  QGraphicsViewPrivate *this_00;
  QObject *pQVar4;
  QMouseEvent *pQVar5;
  QSinglePointEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QGraphicsViewPrivate *d;
  QGraphicsSceneMouseEvent mouseEvent;
  QWidget *in_stack_ffffffffffffff38;
  QGraphicsViewPrivate *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  QFlagsStorage<Qt::MouseEventFlag> in_stack_ffffffffffffff4c;
  uint uVar6;
  QGraphicsViewPrivate *in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_74;
  QPointF local_70;
  QPoint local_60;
  QPointF local_58;
  QPoint local_48;
  QPointF local_40;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  QCursor local_18;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsView *)0xa3e505);
  uVar6 = in_stack_ffffffffffffff60 & 0xffffff;
  if ((this_00->dragMode == RubberBandDrag) &&
     (uVar6 = in_stack_ffffffffffffff60 & 0xffffff, (*(uint *)&this_00->field_0x300 & 1) != 0)) {
    local_c.super_QFlagsStorage<Qt::MouseButton>.i =
         (QFlagsStorage<Qt::MouseButton>)
         QSinglePointEvent::buttons((QSinglePointEvent *)in_stack_ffffffffffffff40);
    bVar1 = QFlags<Qt::MouseButton>::operator!((QFlags<Qt::MouseButton> *)&local_c);
    uVar6 = CONCAT13(bVar1,(int3)uVar6);
  }
  if ((char)(uVar6 >> 0x18) == '\0') {
    if ((this_00->dragMode == ScrollHandDrag) &&
       (MVar2 = QSinglePointEvent::button(in_RSI), MVar2 == LeftButton)) {
      in_stack_ffffffffffffff50 =
           (QGraphicsViewPrivate *)
           QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff40);
      QCursor::QCursor(&local_18,OpenHandCursor);
      QWidget::setCursor(in_RDI,(QCursor *)in_stack_ffffffffffffff50);
      QCursor::~QCursor(&local_18);
      *(uint *)&this_00->field_0x300 = *(uint *)&this_00->field_0x300 & 0xfffffdff;
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3e602);
      if ((bVar1) && ((*(uint *)&this_00->field_0x300 & 1) != 0)) {
        pQVar5 = QEventStorage<QMouseEvent>::operator->(&this_00->lastMouseEvent);
        bVar1 = QEvent::isAccepted((QEvent *)pQVar5);
        if ((!bVar1) && (this_00->handScrollMotions < 7)) {
          QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3e657);
          QGraphicsScene::clearSelection((QGraphicsScene *)in_stack_ffffffffffffff50);
        }
      }
    }
    MVar2 = (MouseButton)((ulong)in_RDI >> 0x20);
  }
  else {
    QGraphicsViewPrivate::clearRubberBand(in_stack_ffffffffffffff50);
    MVar2 = (MouseButton)((ulong)in_RDI >> 0x20);
  }
  QGraphicsViewPrivate::storeMouseEvent
            (in_stack_ffffffffffffff40,(QMouseEvent *)in_stack_ffffffffffffff38);
  if (((*(uint *)&this_00->field_0x300 & 1) != 0) &&
     (bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3e69b), bVar1)) {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
              ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c.i);
    QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff40);
    QGraphicsSceneEvent::setWidget
              ((QGraphicsSceneEvent *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    QGraphicsSceneMouseEvent::setButtonDownScenePos
              ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff50,MVar2,
               (QPointF *)CONCAT44(in_stack_ffffffffffffff4c.i,in_stack_ffffffffffffff48));
    QGraphicsSceneMouseEvent::setButtonDownScreenPos
              ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff50,MVar2,
               (QPoint *)CONCAT44(in_stack_ffffffffffffff4c.i,in_stack_ffffffffffffff48));
    local_58 = QSinglePointEvent::position((QSinglePointEvent *)0xa3e74f);
    local_48 = QPointF::toPoint((QPointF *)in_stack_ffffffffffffff50);
    local_40 = mapToScene((QGraphicsView *)
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          (QPoint *)CONCAT44(in_stack_ffffffffffffff64,uVar6));
    QGraphicsSceneMouseEvent::setScenePos
              ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,
               (QPointF *)in_stack_ffffffffffffff38);
    local_70 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0xa3e7b0);
    local_60 = QPointF::toPoint((QPointF *)in_stack_ffffffffffffff50);
    QGraphicsSceneMouseEvent::setScreenPos
              ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,
               (QPoint *)in_stack_ffffffffffffff38);
    QGraphicsSceneMouseEvent::setLastScenePos
              ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,
               (QPointF *)in_stack_ffffffffffffff38);
    QGraphicsSceneMouseEvent::setLastScreenPos
              ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,
               (QPoint *)in_stack_ffffffffffffff38);
    QSinglePointEvent::buttons((QSinglePointEvent *)in_stack_ffffffffffffff40);
    QGraphicsSceneMouseEvent::setButtons
              ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,
               (MouseButtons)in_stack_ffffffffffffff4c.i);
    QSinglePointEvent::button(in_RSI);
    QGraphicsSceneMouseEvent::setButton
              ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,
               (MouseButton)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    QInputEvent::modifiers((QInputEvent *)in_stack_ffffffffffffff40);
    QGraphicsSceneMouseEvent::setModifiers
              ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,
               (KeyboardModifiers)in_stack_ffffffffffffff4c.i);
    QMouseEvent::source();
    QGraphicsSceneMouseEvent::setSource
              ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,
               (MouseEventSource)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    QMouseEvent::flags();
    QGraphicsSceneMouseEvent::setFlags
              ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff40,
               (MouseEventFlags)in_stack_ffffffffffffff4c.i);
    QEvent::setAccepted((QEvent *)&local_30,false);
    QInputEvent::timestamp((QInputEvent *)in_RSI);
    QGraphicsSceneEvent::setTimestamp
              ((QGraphicsSceneEvent *)in_stack_ffffffffffffff40,(quint64)in_stack_ffffffffffffff38);
    bVar1 = QEvent::spontaneous((QEvent *)in_RSI);
    if (bVar1) {
      ::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3e8e8);
      qt_sendSpontaneousEvent
                ((QObject *)in_stack_ffffffffffffff40,(QEvent *)in_stack_ffffffffffffff38);
    }
    else {
      pQVar4 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3e90b)->
                super_QObject;
      QCoreApplication::sendEvent(pQVar4,(QEvent *)&local_30);
    }
    pQVar5 = QEventStorage<QMouseEvent>::operator->(&this_00->lastMouseEvent);
    bVar1 = QEvent::isAccepted((QEvent *)&local_30);
    (**(code **)(*(long *)pQVar5 + 0x10))(pQVar5,bVar1);
    bVar1 = QEvent::isAccepted((QEvent *)&local_30);
    (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,bVar1);
    bVar1 = QEvent::isAccepted((QEvent *)&local_30);
    uVar6 = in_stack_ffffffffffffff4c.i & 0xffffff;
    if (bVar1) {
      local_74.super_QFlagsStorage<Qt::MouseButton>.i =
           (QFlagsStorage<Qt::MouseButton>)
           QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)in_RSI);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_74);
      uVar6 = uVar6 & 0xffffff;
      if (IVar3 == 0) {
        QAbstractScrollArea::viewport((QAbstractScrollArea *)in_RSI);
        bVar1 = QWidget::testAttribute
                          ((QWidget *)CONCAT44(uVar6,in_stack_ffffffffffffff48),
                           (WidgetAttribute)((ulong)in_RSI >> 0x20));
        uVar6 = (uint)bVar1 << 0x18;
      }
    }
    if ((char)(uVar6 >> 0x18) != '\0') {
      QGraphicsViewPrivate::_q_unsetViewportCursor(this_00);
    }
    QGraphicsSceneMouseEvent::~QGraphicsSceneMouseEvent((QGraphicsSceneMouseEvent *)0xa3e9ff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::mouseReleaseEvent(QMouseEvent *event)
{
    Q_D(QGraphicsView);

#if QT_CONFIG(rubberband)
    if (d->dragMode == QGraphicsView::RubberBandDrag && d->sceneInteractionAllowed && !event->buttons()) {
        d->clearRubberBand();
    } else
#endif
    if (d->dragMode == QGraphicsView::ScrollHandDrag && event->button() == Qt::LeftButton) {
#ifndef QT_NO_CURSOR
        // Restore the open hand cursor. ### There might be items
        // under the mouse that have a valid cursor at this time, so
        // we could repeat the steps from mouseMoveEvent().
        viewport()->setCursor(Qt::OpenHandCursor);
#endif
        d->handScrolling = false;

        if (d->scene && d->sceneInteractionAllowed && !d->lastMouseEvent->isAccepted() && d->handScrollMotions <= 6) {
            // If we've detected very little motion during the hand drag, and
            // no item accepted the last event, we'll interpret that as a
            // click to the scene, and reset the selection.
            d->scene->clearSelection();
        }
    }

    d->storeMouseEvent(event);

    if (!d->sceneInteractionAllowed)
        return;

    if (!d->scene)
        return;

    QGraphicsSceneMouseEvent mouseEvent(QEvent::GraphicsSceneMouseRelease);
    mouseEvent.setWidget(viewport());
    mouseEvent.setButtonDownScenePos(d->mousePressButton, d->mousePressScenePoint);
    mouseEvent.setButtonDownScreenPos(d->mousePressButton, d->mousePressScreenPoint);
    mouseEvent.setScenePos(mapToScene(event->position().toPoint()));
    mouseEvent.setScreenPos(event->globalPosition().toPoint());
    mouseEvent.setLastScenePos(d->lastMouseMoveScenePoint);
    mouseEvent.setLastScreenPos(d->lastMouseMoveScreenPoint);
    mouseEvent.setButtons(event->buttons());
    mouseEvent.setButton(event->button());
    mouseEvent.setModifiers(event->modifiers());
    mouseEvent.setSource(event->source());
    mouseEvent.setFlags(event->flags());
    mouseEvent.setAccepted(false);
    mouseEvent.setTimestamp(event->timestamp());
    if (event->spontaneous())
        qt_sendSpontaneousEvent(d->scene, &mouseEvent);
    else
        QCoreApplication::sendEvent(d->scene, &mouseEvent);

    // Update the last and current mouse events' accepted state.
    d->lastMouseEvent->setAccepted(mouseEvent.isAccepted());
    event->setAccepted(mouseEvent.isAccepted());

#ifndef QT_NO_CURSOR
    if (mouseEvent.isAccepted() && mouseEvent.buttons() == 0 && viewport()->testAttribute(Qt::WA_SetCursor)) {
        // The last mouse release on the viewport will trigger clearing the cursor.
        d->_q_unsetViewportCursor();
    }
#endif
}